

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::Cast_x86_fma::forward(Cast_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int _d;
  uint _c;
  int iVar2;
  int _elempack;
  int *piVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  undefined1 auVar7 [32];
  unsigned_short uVar8;
  void *pvVar9;
  ulong uVar10;
  undefined1 (*pauVar11) [32];
  ulong uVar12;
  ulong uVar13;
  void *pvVar14;
  undefined1 (*pauVar15) [16];
  int i;
  int iVar16;
  ulong uVar17;
  size_t sVar18;
  uint uVar19;
  int iVar20;
  long lVar21;
  undefined1 (*pauVar22) [16];
  int iVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  
  iVar23 = (this->super_Cast).type_from;
  iVar16 = (this->super_Cast).type_to;
  if (iVar23 == iVar16) {
    iVar23 = 0;
    if (top_blob != bottom_blob) {
      piVar3 = bottom_blob->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      piVar3 = top_blob->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            free(top_blob->data);
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->c = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      piVar3 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar3;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar16 = bottom_blob->w;
      iVar20 = bottom_blob->h;
      iVar1 = bottom_blob->d;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar16;
      top_blob->h = iVar20;
      top_blob->d = iVar1;
      top_blob->c = bottom_blob->c;
      top_blob->cstep = bottom_blob->cstep;
    }
  }
  else {
    iVar20 = bottom_blob->w;
    iVar1 = bottom_blob->h;
    _d = bottom_blob->d;
    _c = bottom_blob->c;
    iVar2 = bottom_blob->dims;
    _elempack = bottom_blob->elempack;
    sVar18 = (size_t)_elempack;
    switch(iVar16) {
    case 1:
      if (iVar23 == 3) {
        Cast::forward(&this->super_Cast,bottom_blob,top_blob,opt);
      }
      sVar18 = sVar18 * 4;
      break;
    case 2:
    case 4:
      sVar18 = (size_t)(_elempack * 2);
      break;
    case 3:
      break;
    default:
      sVar18 = bottom_blob->elemsize;
    }
    switch(iVar2) {
    case 1:
      Mat::create(top_blob,iVar20,sVar18,_elempack,opt->blob_allocator);
      break;
    case 2:
      Mat::create(top_blob,iVar20,iVar1,sVar18,_elempack,opt->blob_allocator);
      break;
    case 3:
      Mat::create(top_blob,iVar20,iVar1,_c,sVar18,_elempack,opt->blob_allocator);
      break;
    case 4:
      Mat::create(top_blob,iVar20,iVar1,_d,_c,sVar18,_elempack,opt->blob_allocator);
    }
    iVar23 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      iVar23 = (this->super_Cast).type_from;
      iVar16 = (this->super_Cast).type_to;
      if (iVar16 == 2 && iVar23 == 1) {
        iVar23 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
        uVar12 = 0;
        uVar10 = (ulong)(uint)bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar10 = uVar12;
        }
        for (; uVar12 != uVar10; uVar12 = uVar12 + 1) {
          pvVar9 = bottom_blob->data;
          sVar18 = bottom_blob->elemsize;
          sVar4 = bottom_blob->cstep;
          pauVar11 = (undefined1 (*) [32])(sVar4 * uVar12 * sVar18 + (long)pvVar9);
          pvVar14 = top_blob->data;
          sVar5 = top_blob->elemsize;
          sVar6 = top_blob->cstep;
          pauVar15 = (undefined1 (*) [16])(sVar6 * uVar12 * sVar5 + (long)pvVar14);
          lVar21 = 0;
          for (iVar16 = 0; iVar16 + 7 < iVar23; iVar16 = iVar16 + 8) {
            auVar25 = vcvtps2ph_f16c(*pauVar11,8);
            *pauVar15 = auVar25;
            pauVar11 = pauVar11 + 1;
            pauVar15 = pauVar15 + 1;
            lVar21 = lVar21 + 8;
          }
          for (; iVar16 + 3 < iVar23; iVar16 = iVar16 + 4) {
            vcvtps2ph_f16c(*(undefined1 (*) [16])*pauVar11,8);
            pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
            lVar21 = lVar21 + 4;
          }
          for (; (int)lVar21 < iVar23; lVar21 = lVar21 + 1) {
            uVar8 = float32_to_float16(*(float *)((long)pvVar9 +
                                                 lVar21 * 4 + sVar4 * sVar18 * uVar12));
            *(unsigned_short *)((long)pvVar14 + lVar21 * 2 + sVar6 * sVar5 * uVar12) = uVar8;
          }
        }
        iVar23 = (this->super_Cast).type_from;
        iVar16 = (this->super_Cast).type_to;
      }
      if (iVar16 == 1 && iVar23 == 2) {
        iVar23 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
        uVar12 = 0;
        uVar10 = (ulong)(uint)bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar10 = uVar12;
        }
        for (; uVar12 != uVar10; uVar12 = uVar12 + 1) {
          pvVar9 = bottom_blob->data;
          sVar18 = bottom_blob->elemsize;
          sVar4 = bottom_blob->cstep;
          pauVar15 = (undefined1 (*) [16])(sVar4 * uVar12 * sVar18 + (long)pvVar9);
          pvVar14 = top_blob->data;
          sVar5 = top_blob->elemsize;
          sVar6 = top_blob->cstep;
          pauVar11 = (undefined1 (*) [32])(sVar6 * uVar12 * sVar5 + (long)pvVar14);
          lVar21 = 0;
          for (iVar16 = 0; iVar16 + 7 < iVar23; iVar16 = iVar16 + 8) {
            auVar7 = vcvtph2ps_f16c(*pauVar15);
            *pauVar11 = auVar7;
            pauVar15 = pauVar15 + 1;
            pauVar11 = pauVar11 + 1;
            lVar21 = lVar21 + 8;
          }
          for (; iVar16 + 3 < iVar23; iVar16 = iVar16 + 4) {
            auVar25._8_8_ = 0;
            auVar25._0_8_ = *(ulong *)*pauVar15;
            auVar25 = vcvtph2ps_f16c(auVar25);
            *(undefined1 (*) [16])*pauVar11 = auVar25;
            pauVar15 = (undefined1 (*) [16])(*pauVar15 + 8);
            pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
            lVar21 = lVar21 + 4;
          }
          for (; (int)lVar21 < iVar23; lVar21 = lVar21 + 1) {
            fVar24 = float16_to_float32(*(unsigned_short *)
                                         ((long)pvVar9 + lVar21 * 2 + sVar4 * sVar18 * uVar12));
            *(float *)((long)pvVar14 + lVar21 * 4 + sVar6 * sVar5 * uVar12) = fVar24;
          }
        }
        iVar23 = (this->super_Cast).type_from;
        iVar16 = (this->super_Cast).type_to;
      }
      if ((iVar23 == 3) && (iVar16 == 1)) {
        uVar19 = _d * _elempack * iVar1 * iVar20;
        pvVar9 = bottom_blob->data;
        sVar18 = bottom_blob->cstep;
        pvVar14 = top_blob->data;
        sVar4 = top_blob->cstep;
        sVar5 = top_blob->elemsize;
        uVar12 = 0;
        uVar10 = (ulong)uVar19;
        if ((int)uVar19 < 1) {
          uVar10 = uVar12;
        }
        uVar13 = (ulong)_c;
        if ((int)_c < 1) {
          uVar13 = uVar12;
        }
        sVar6 = bottom_blob->elemsize;
        for (; uVar12 != uVar13; uVar12 = uVar12 + 1) {
          for (uVar17 = 0; uVar10 != uVar17; uVar17 = uVar17 + 1) {
            *(float *)((long)pvVar14 + uVar17 * 4) = (float)(int)*(char *)((long)pvVar9 + uVar17);
          }
          pvVar14 = (void *)((long)pvVar14 + sVar4 * sVar5);
          pvVar9 = (void *)((long)pvVar9 + sVar18 * sVar6);
        }
        iVar16 = (this->super_Cast).type_to;
      }
      if ((iVar23 == 1) && (iVar16 == 4)) {
        iVar23 = cpu_support_x86_avx2();
        if (iVar23 == 0) {
          iVar23 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
          uVar12 = 0;
          uVar10 = (ulong)(uint)bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar10 = uVar12;
          }
          for (; uVar12 != uVar10; uVar12 = uVar12 + 1) {
            pvVar9 = bottom_blob->data;
            sVar18 = bottom_blob->elemsize;
            sVar4 = bottom_blob->cstep;
            pauVar15 = (undefined1 (*) [16])(sVar4 * uVar12 * sVar18 + (long)pvVar9);
            pvVar14 = top_blob->data;
            sVar5 = top_blob->elemsize;
            sVar6 = top_blob->cstep;
            pauVar22 = (undefined1 (*) [16])(sVar6 * uVar12 * sVar5 + (long)pvVar14);
            lVar21 = 0;
            for (iVar16 = 0; iVar16 + 0xf < iVar23; iVar16 = iVar16 + 0x10) {
              auVar25 = vpsrld_avx(*pauVar15,0x10);
              auVar26 = vpsrld_avx(pauVar15[1],0x10);
              auVar25 = vpackusdw_avx(auVar25,auVar26);
              auVar26 = vpsrld_avx(pauVar15[2],0x10);
              auVar27 = vpsrld_avx(pauVar15[3],0x10);
              auVar26 = vpackusdw_avx(auVar26,auVar27);
              pauVar22[1] = auVar26;
              *pauVar22 = auVar25;
              pauVar15 = pauVar15 + 4;
              pauVar22 = pauVar22 + 2;
              lVar21 = lVar21 + 0x10;
            }
            for (; iVar16 + 7 < iVar23; iVar16 = iVar16 + 8) {
              auVar25 = vpsrld_avx(*pauVar15,0x10);
              auVar26 = vpsrld_avx(pauVar15[1],0x10);
              auVar25 = vpackusdw_avx(auVar25,auVar26);
              *pauVar22 = auVar25;
              pauVar15 = pauVar15 + 2;
              pauVar22 = pauVar22 + 1;
              lVar21 = lVar21 + 8;
            }
            for (; (int)lVar21 < iVar23; lVar21 = lVar21 + 1) {
              *(undefined2 *)((long)pvVar14 + lVar21 * 2 + sVar6 * sVar5 * uVar12) =
                   *(undefined2 *)((long)pvVar9 + lVar21 * 4 + sVar4 * sVar18 * uVar12 + 2);
            }
          }
        }
        else {
          cast_fp32_to_bf16_sse_avx2(bottom_blob,top_blob,opt);
        }
      }
      iVar23 = 0;
      if (((this->super_Cast).type_from == 4) && ((this->super_Cast).type_to == 1)) {
        iVar16 = cpu_support_x86_avx2();
        if (iVar16 == 0) {
          iVar16 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
          iVar23 = 0;
          uVar10 = (ulong)(uint)bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar10 = 0;
          }
          for (uVar12 = 0; uVar12 != uVar10; uVar12 = uVar12 + 1) {
            pvVar9 = bottom_blob->data;
            sVar18 = bottom_blob->elemsize;
            sVar4 = bottom_blob->cstep;
            pauVar22 = (undefined1 (*) [16])(sVar4 * uVar12 * sVar18 + (long)pvVar9);
            pvVar14 = top_blob->data;
            sVar5 = top_blob->elemsize;
            sVar6 = top_blob->cstep;
            pauVar15 = (undefined1 (*) [16])(sVar6 * uVar12 * sVar5 + (long)pvVar14);
            lVar21 = 0;
            for (iVar20 = 0; iVar20 + 7 < iVar16; iVar20 = iVar20 + 8) {
              auVar26 = vpunpcklwd_avx((undefined1  [16])0x0,*pauVar22);
              auVar25 = vpunpckhwd_avx((undefined1  [16])0x0,*pauVar22);
              pauVar15[1] = auVar25;
              *pauVar15 = auVar26;
              pauVar22 = pauVar22 + 1;
              pauVar15 = pauVar15 + 2;
              lVar21 = lVar21 + 8;
            }
            for (; iVar20 + 3 < iVar16; iVar20 = iVar20 + 4) {
              auVar26._8_8_ = 0;
              auVar26._0_8_ = *(ulong *)*pauVar22;
              auVar25 = vpunpcklwd_avx((undefined1  [16])0x0,auVar26);
              *pauVar15 = auVar25;
              pauVar22 = (undefined1 (*) [16])(*pauVar22 + 8);
              pauVar15 = pauVar15 + 1;
              lVar21 = lVar21 + 4;
            }
            for (; (int)lVar21 < iVar16; lVar21 = lVar21 + 1) {
              *(uint *)((long)pvVar14 + lVar21 * 4 + sVar6 * sVar5 * uVar12) =
                   (uint)*(ushort *)((long)pvVar9 + lVar21 * 2 + sVar4 * sVar18 * uVar12) << 0x10;
            }
          }
        }
        else {
          cast_bf16_to_fp32_sse_avx2(bottom_blob,top_blob,opt);
        }
      }
    }
  }
  return iVar23;
}

Assistant:

int Cast_x86_fma::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (type_from == type_to)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    size_t out_elemsize = elemsize;
    if (type_to == 1)
    {
        if (type_from == 3)
        {
            Cast::forward(bottom_blob, top_blob, opt);
        }

        // float32
        out_elemsize = 4 * elempack;
    }
    else if (type_to == 2)
    {
        // float16
        out_elemsize = 2 * elempack;
    }
    else if (type_to == 3)
    {
        // int8
        out_elemsize = elempack;
    }
    else if (type_to == 4)
    {
        // bfloat16
        out_elemsize = 2 * elempack;
    }

    if (dims == 1)
    {
        top_blob.create(w, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 2)
    {
        top_blob.create(w, h, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 3)
    {
        top_blob.create(w, h, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 4)
    {
        top_blob.create(w, h, d, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int size = w * h * d * elempack;

    if (type_from == 1 && type_to == 2)
    {
        cast_fp32_to_fp16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 2 && type_to == 1)
    {
        cast_fp16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 3 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const signed char* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = (float)ptr[i];
            }
        }
    }

    if (type_from == 1 && type_to == 4)
    {
        cast_fp32_to_bf16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 4 && type_to == 1)
    {
        cast_bf16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    return 0;
}